

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelRead.cpp
# Opt level: O2

expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *
idx2::ParallelReadChunkExponents
          (expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *__return_storage_ptr__,
          idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband)

{
  byte *pbVar1;
  i64 iVar2;
  allocator *paVar3;
  byte *pbVar4;
  u64 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  decode_data *pdVar8;
  i64 iVar9;
  bool bVar10;
  __off_t _Var11;
  __off_t _Var12;
  FILE *__stream;
  long lVar13;
  byte bVar14;
  unsigned_long *Key;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  FILE *pFVar20;
  FILE *pFVar21;
  undefined7 in_register_00000081;
  chunk_exp_cache *Val;
  undefined7 in_register_00000089;
  ulong uVar22;
  ulong uVar23;
  bucket_status *pbVar24;
  size_t sVar25;
  long *in_FS_OFFSET;
  stref sVar26;
  int NChunks;
  decode_data *local_2c8;
  FILE *Fp;
  expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *local_2b8;
  idx2_file *local_2b0;
  undefined4 local_2a8;
  uint local_2a4;
  int S;
  int ExponentSize;
  timer IOTimer_1;
  FILE *local_280;
  ulong local_278;
  uint local_270;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:370:5)>
  __ScopeGuard__370;
  file_id FileId;
  iterator FileCacheIt;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:227:3)>
  __ScopeGuard__227;
  FILE *Fp_1;
  long lStack_200;
  mallocator *local_1f8;
  u64 local_1f0;
  u64 ChunkAddr;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:249:3)>
  __ScopeGuard__249;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:243:3)>
  __ScopeGuard__243;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:240:3)>
  __ScopeGuard__240;
  int ChunkAddrsSz;
  unique_lock<std::mutex> Lock;
  timer IOTimer;
  u64 ChunkAddress;
  chunk_exp_cache *pcStack_180;
  mallocator *local_178;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:356:5)>
  __ScopeGuard__356;
  file_cache FileCache;
  chunk_exp_cache ChunkExpCache;
  
  std::unique_lock<std::mutex>::unique_lock(&Lock,&D->FileCacheMutex);
  local_2a4 = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_2b0 = Idx2;
  ConstructFilePath(&FileId,Idx2,Brick,(i8)Key,Subband,0);
  Lookup<unsigned_long,idx2::file_cache>
            (&FileCacheIt,(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)&FileId.Id,Key);
  clock_gettime(1,(timespec *)&IOTimer);
  pbVar24 = (FileCacheIt.Ht)->Stats;
  if ((pbVar24[FileCacheIt.Idx] == Occupied) && ((FileCacheIt.Val)->ExpCached == true)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xe1;
LAB_00176ace:
    if (pbVar24[FileCacheIt.Idx] == Occupied) {
      if ('\x0f' < (char)local_2a4) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar16 = (ulong)(local_2b0->BricksPerChunk).Arr[(char)local_2a4];
      lVar19 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      bVar14 = -(uVar16 == 0) | (byte)lVar19;
      ChunkAddress = (long)((int)Subband << 0xc) + ((ulong)(local_2a4 & 0xff) << 0x3c) +
                     (Brick >> ((1L << (bVar14 & 0x3f) != uVar16) + bVar14 & 0x3f)) * 0x40000;
      Lookup<unsigned_long,idx2::chunk_exp_cache>
                ((iterator *)&FileCache,(idx2 *)&(FileCacheIt.Val)->ChunkExpCaches,
                 (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)&ChunkAddress,
                 (unsigned_long *)ChunkAddress);
      iVar9 = FileCache.ChunkOffsets.Buffer.Bytes;
      if (*(char *)((long)FileCache.ChunkOffsets.Buffer.Alloc[2]._vptr_allocator +
                   FileCache.ChunkOffsets.Size) == '\x02') {
        if (*(long *)(FileCache.ChunkOffsets.Buffer.Bytes + 0x10) == 0) {
          clock_gettime(1,(timespec *)&IOTimer_1);
          __stream = fopen(FileId.Name.field_0.Ptr,"rb");
          __ScopeGuard__356.Func.Fp = &Fp_1;
          __ScopeGuard__356.Dismissed = false;
          local_2b8 = __return_storage_ptr__;
          Fp_1 = (FILE *)__stream;
          if (__stream == (FILE *)0x0) {
            *(char **)(*in_FS_OFFSET + -0xb80) =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
            ;
            *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x166;
            sVar26 = ToString(FileNotFound);
            lVar19 = *in_FS_OFFSET;
            iVar18 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                              (ulong)(uint)sVar26.Size,sVar26.field_0.Ptr,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                              ,0x166);
            snprintf((char *)(lVar19 + -0xf80) + iVar18,0x400 - (long)iVar18,"File: %s\n",
                     FileId.Name.field_0.Ptr);
            local_2b8->_vptr_expected = (_func_int **)&PTR__expected_001aec18;
            (local_2b8->field_1).Err.Msg = "File: %s\n";
            (local_2b8->field_1).Err.StrGened = true;
            *(undefined2 *)((long)&local_2b8->field_1 + 8) = 0x25;
            *(undefined4 *)((long)&local_2b8->field_1 + 0xb) =
                 FileCache.ChunkOffsets.Buffer.Data._0_4_;
            *(undefined1 *)((long)&local_2b8->field_1 + 0xf) =
                 FileCache.ChunkOffsets.Buffer.Data._4_1_;
            local_2b8->Ok = false;
          }
          else {
            lVar13 = (long)*(int *)iVar9;
            pbVar1 = ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Data;
            lVar19 = (FileCacheIt.Val)->ExponentBeginOffset;
            iVar18 = *(int *)(pbVar1 + lVar13 * 4);
            if (0 < lVar13) {
              iVar17 = *(int *)(pbVar1 + lVar13 * 4 + -4);
              lVar19 = lVar19 + iVar17;
              iVar18 = iVar18 - iVar17;
            }
            local_2c8 = D;
            fseeko(__stream,lVar19,0);
            Mallocator();
            FileCache.ChunkOffsets.Buffer.Data = (byte *)0x0;
            FileCache.ChunkOffsets.Buffer.Bytes = 0;
            FileCache.ChunkOffsets.Buffer.Alloc = &Mallocator::Instance.super_allocator;
            __ScopeGuard__370._8_8_ = __ScopeGuard__370._8_8_ & 0xffffffffffffff00;
            sVar25 = (size_t)iVar18;
            __ScopeGuard__370.Func.CompressedChunkExpsBuf = (buffer *)&FileCache;
            Mallocator();
            AllocBuf((buffer *)&FileCache,sVar25,&Mallocator::Instance.super_allocator);
            fread(FileCache.ChunkOffsets.Buffer.Data,sVar25,1,(FILE *)Fp_1);
            DecompressBufZstd((buffer *)&FileCache,(bitstream *)(iVar9 + 8));
            pdVar8 = local_2c8;
            LOCK();
            (local_2c8->BytesDecoded_).super___atomic_base<unsigned_long>._M_i =
                 (local_2c8->BytesDecoded_).super___atomic_base<unsigned_long>._M_i + sVar25;
            UNLOCK();
            LOCK();
            (local_2c8->BytesExps_).super___atomic_base<unsigned_long>._M_i =
                 (local_2c8->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar25;
            UNLOCK();
            clock_gettime(1,(timespec *)&ChunkExpCache);
            LOCK();
            (pdVar8->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
                 (pdVar8->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
                 (long)((double)(CONCAT44(ChunkExpCache._4_4_,ChunkExpCache.ChunkPos) -
                                IOTimer_1.Start.tv_sec) * 1000000000.0 +
                       (double)((long)ChunkExpCache.ChunkExpStream.Stream.Data -
                               IOTimer_1.Start.tv_nsec));
            UNLOCK();
            *(undefined8 *)(iVar9 + 0x28) = 0;
            *(undefined8 **)(iVar9 + 0x20) = *(undefined8 **)(iVar9 + 8);
            *(undefined8 *)(iVar9 + 0x28) = **(undefined8 **)(iVar9 + 8);
            *(undefined4 *)(iVar9 + 0x30) = 0;
            scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:370:5)>
            ::~scope_guard(&__ScopeGuard__370);
          }
          __return_storage_ptr__ = local_2b8;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:356:5)>
          ::~scope_guard(&__ScopeGuard__356);
          if (__stream == (FILE *)0x0) goto LAB_0017705b;
        }
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001aec18;
        pbVar1 = *(byte **)(iVar9 + 8);
        iVar2 = *(i64 *)(iVar9 + 0x10);
        paVar3 = *(allocator **)(iVar9 + 0x18);
        pbVar4 = *(byte **)(iVar9 + 0x20);
        uVar5 = *(u64 *)(iVar9 + 0x28);
        uVar6 = *(undefined8 *)(iVar9 + 0x30);
        uVar7 = *(undefined8 *)(iVar9 + 0x38);
        (__return_storage_ptr__->field_1).Err.Msg = *(cstr *)iVar9;
        (__return_storage_ptr__->field_1).Val.ChunkExpStream.Stream.Data = pbVar1;
        (__return_storage_ptr__->field_1).Val.ChunkExpStream.Stream.Bytes = iVar2;
        (__return_storage_ptr__->field_1).Val.ChunkExpStream.Stream.Alloc = paVar3;
        (__return_storage_ptr__->field_1).Val.ChunkExpStream.BitPtr = pbVar4;
        (__return_storage_ptr__->field_1).Val.ChunkExpStream.BitBuf = uVar5;
        *(undefined8 *)&(__return_storage_ptr__->field_1).Val.ChunkExpStream.BitPos = uVar6;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = uVar7;
        bVar10 = true;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x15d;
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001aec18;
        (__return_storage_ptr__->field_1).Err.Msg = "";
        (__return_storage_ptr__->field_1).Err.StrGened = false;
        *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x23;
        bVar10 = false;
      }
      __return_storage_ptr__->Ok = bVar10;
      goto LAB_0017705b;
    }
  }
  else {
    Fp = (FILE *)fopen(FileId.Name.field_0.Ptr,"rb");
    __ScopeGuard__227.Func.Fp = &Fp;
    __ScopeGuard__227.Dismissed = false;
    if ((FILE *)Fp == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xe4;
      sVar26 = ToString(FileNotFound);
      lVar19 = *in_FS_OFFSET;
      iVar18 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)(uint)sVar26.Size,sVar26.field_0.Ptr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                        ,0xe4);
      snprintf((char *)(lVar19 + -0xf80) + iVar18,0x400 - (long)iVar18,"File: %s",
               FileId.Name.field_0.Ptr);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:227:3)>
      ::~scope_guard(&__ScopeGuard__227);
    }
    else {
      local_2c8 = D;
      local_2b8 = __return_storage_ptr__;
      local_2a8 = (int)CONCAT71(in_register_00000089,Subband);
      local_1f0 = Brick;
      fseeko((FILE *)Fp,0,2);
      _Var11 = ftello((FILE *)Fp);
      pFVar21 = Fp;
      ExponentSize = 0;
      _Var12 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar21,_Var12 + -4,0);
      fread(&ExponentSize,4,1,(FILE *)pFVar21);
      fseeko((FILE *)pFVar21,_Var12 + -4,0);
      pFVar21 = Fp;
      NChunks = 0;
      _Var12 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar21,_Var12 + -4,0);
      fread(&NChunks,4,1,(FILE *)pFVar21);
      fseeko((FILE *)pFVar21,_Var12 + -4,0);
      pFVar21 = Fp;
      _Var12 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar21,_Var12 + -4,0);
      fread(&ChunkAddrsSz,4,1,(FILE *)pFVar21);
      fseeko((FILE *)pFVar21,_Var12 + -4,0);
      Mallocator();
      __ScopeGuard__370.Func.CompressedChunkExpsBuf = (buffer *)0x0;
      __ScopeGuard__370.Dismissed = false;
      __ScopeGuard__370._9_7_ = 0;
      __ScopeGuard__240.Dismissed = false;
      sVar25 = (size_t)ChunkAddrsSz;
      __ScopeGuard__240.Func.CpresChunkAddrs = (buffer *)&__ScopeGuard__370;
      Mallocator();
      AllocBuf((buffer *)&__ScopeGuard__370,sVar25,&Mallocator::Instance.super_allocator);
      pFVar21 = Fp;
      if ((long)__ScopeGuard__370._8_8_ < (long)sVar25) {
LAB_00177080:
        __assert_fail("Sz <= Size(*Buf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                      ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
      }
      _Var12 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar21,_Var12 - sVar25,0);
      fread(__ScopeGuard__370.Func.CompressedChunkExpsBuf,sVar25,1,(FILE *)pFVar21);
      fseeko((FILE *)pFVar21,_Var12 - sVar25,0);
      LOCK();
      (local_2c8->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (local_2c8->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar25;
      UNLOCK();
      Mallocator();
      ChunkAddress = 0;
      pcStack_180 = (chunk_exp_cache *)0x0;
      local_178 = &Mallocator::Instance;
      __ScopeGuard__243.Dismissed = false;
      lVar19 = (long)NChunks;
      __ScopeGuard__243.Func.ChunkAddrsBuf = (buffer *)&ChunkAddress;
      Mallocator();
      AllocBuf((buffer *)&ChunkAddress,lVar19 << 3,&Mallocator::Instance.super_allocator);
      DecompressBufZstd((buffer *)&__ScopeGuard__370,(buffer *)&ChunkAddress);
      pFVar21 = Fp;
      S = 0;
      _Var12 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar21,_Var12 + -4,0);
      fread(&S,4,1,(FILE *)pFVar21);
      fseeko((FILE *)pFVar21,_Var12 + -4,0);
      Mallocator();
      Fp_1 = (FILE *)0x0;
      lStack_200 = 0;
      local_1f8 = &Mallocator::Instance;
      __ScopeGuard__249.Dismissed = false;
      sVar25 = (size_t)S;
      __ScopeGuard__249.Func.ChunkExpSizesBuf = (buffer *)&Fp_1;
      Mallocator();
      AllocBuf((buffer *)&Fp_1,sVar25,&Mallocator::Instance.super_allocator);
      pFVar21 = Fp;
      if (lStack_200 < (long)sVar25) goto LAB_00177080;
      _Var12 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar21,_Var12 - sVar25,0);
      fread(Fp_1,sVar25,1,(FILE *)pFVar21);
      fseeko((FILE *)pFVar21,_Var12 - sVar25,0);
      pdVar8 = local_2c8;
      LOCK();
      (local_2c8->BytesExps_).super___atomic_base<unsigned_long>._M_i =
           (local_2c8->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar25 + 4;
      UNLOCK();
      clock_gettime(1,(timespec *)&FileCache);
      LOCK();
      (pdVar8->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar8->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)((long)FileCache.ChunkOffsets.Buffer.Data - IOTimer.Start.tv_sec) *
                  1000000000.0 +
                 (double)(FileCache.ChunkOffsets.Buffer.Bytes - IOTimer.Start.tv_nsec));
      UNLOCK();
      bitstream::bitstream((bitstream *)&IOTimer_1);
      IOTimer_1.Start.tv_sec = (__time_t)Fp_1;
      IOTimer_1.Start.tv_nsec = lStack_200;
      local_280 = Fp_1;
      local_278 = *(ulong *)Fp_1;
      local_270 = 0;
      file_cache::file_cache(&FileCache);
      Mallocator();
      Init<unsigned_long,idx2::chunk_exp_cache>
                (&FileCache.ChunkExpCaches,10,&Mallocator::Instance.super_allocator);
      FileCache.ExponentBeginOffset = _Var11 - ExponentSize;
      lVar19 = (long)S;
      GrowCapacity<int>(&FileCache.ChunkExpOffsets,lVar19);
      uVar16 = 0;
      iVar18 = 0;
      while( true ) {
        __return_storage_ptr__ = local_2b8;
        iVar17 = (int)uVar16;
        if (lVar19 <= (long)(local_280 + ((int)(local_270 + 7) / 8 - IOTimer_1.Start.tv_sec)))
        break;
        bVar14 = 0;
        lVar13 = 0;
        pFVar21 = local_280;
        uVar22 = local_278;
        do {
          pFVar20 = pFVar21;
          if (0x39 < (int)local_270) {
            pFVar20 = pFVar21 + (local_270 >> 3);
            uVar22 = *(ulong *)(pFVar21 + (local_270 >> 3));
            local_270 = local_270 & 7;
            local_280 = pFVar20;
            local_278 = uVar22;
          }
          uVar23 = uVar22 >> ((byte)local_270 & 0x3f);
          uVar15 = local_270 + 7;
          pFVar21 = pFVar20;
          if (0x38 < (int)local_270) {
            pFVar21 = pFVar20 + (uVar15 >> 3);
            uVar22 = *(ulong *)(pFVar20 + (uVar15 >> 3));
            uVar15 = 0;
            local_280 = pFVar21;
            local_278 = uVar22;
          }
          lVar13 = lVar13 + ((uVar23 & bitstream::Masks.Arr[7]) << (bVar14 & 0x3f));
          local_270 = uVar15 + 1;
          bVar14 = bVar14 + 7;
        } while ((uVar22 >> ((byte)uVar15 & 0x3f) & bitstream::Masks.Arr[1]) != 0);
        Val = (chunk_exp_cache *)bitstream::Masks.Arr[1];
        if (FileCache.ChunkExpOffsets.Capacity <= FileCache.ChunkExpOffsets.Size) {
          GrowCapacity<int>(&FileCache.ChunkExpOffsets,0);
        }
        iVar18 = iVar18 + (int)lVar13;
        *(int *)(FileCache.ChunkExpOffsets.Buffer.Data + FileCache.ChunkExpOffsets.Size * 4) =
             iVar18;
        ChunkAddr = *(u64 *)(ChunkAddress + uVar16 * 8);
        FileCache.ChunkExpOffsets.Size = FileCache.ChunkExpOffsets.Size + 1;
        chunk_exp_cache::chunk_exp_cache(&ChunkExpCache);
        ChunkExpCache.ChunkPos = iVar17;
        Insert<unsigned_long,idx2::chunk_exp_cache>
                  ((iterator *)&__ScopeGuard__356,(idx2 *)&FileCache.ChunkExpCaches,
                   (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)&ChunkAddr,
                   (unsigned_long *)&ChunkExpCache,Val);
        uVar16 = uVar16 + 1;
      }
      if (NChunks == iVar17) {
        if ((long)iVar17 % (local_2b0->Subbands).Size != 0) {
          *(char **)(*in_FS_OFFSET + -0xb80) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x11c;
          sVar26 = ToString(SizeMismatched);
          __return_storage_ptr__ = local_2b8;
          lVar19 = *in_FS_OFFSET;
          iVar18 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)(uint)sVar26.Size,sVar26.field_0.Ptr,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                            ,0x11c);
          snprintf((char *)(lVar19 + -0xf80) + iVar18,0x400 - (long)iVar18,
                   "number of chunks = %d is not divisible by number of subbands which is %d\n",
                   (ulong)(uint)NChunks,(ulong)(uint)(local_2b0->Subbands).Size);
          goto LAB_00176a68;
        }
        if ((FileCacheIt.Ht)->Stats[FileCacheIt.Idx] == Occupied) {
          (FileCacheIt.Val)->ExponentBeginOffset = FileCache.ExponentBeginOffset;
          ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Data = FileCache.ChunkExpOffsets.Buffer.Data;
          ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Bytes = FileCache.ChunkExpOffsets.Buffer.Bytes
          ;
          ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Alloc = FileCache.ChunkExpOffsets.Buffer.Alloc
          ;
          ((FileCacheIt.Val)->ChunkExpOffsets).Size = FileCache.ChunkExpOffsets.Size;
          ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Alloc = FileCache.ChunkExpOffsets.Buffer.Alloc
          ;
          ((FileCacheIt.Val)->ChunkExpOffsets).Size = FileCache.ChunkExpOffsets.Size;
          ((FileCacheIt.Val)->ChunkExpOffsets).Capacity = FileCache.ChunkExpOffsets.Capacity;
          ((FileCacheIt.Val)->ChunkExpOffsets).Alloc = FileCache.ChunkExpOffsets.Alloc;
          ((FileCacheIt.Val)->ChunkExpCaches).Keys = FileCache.ChunkExpCaches.Keys;
          ((FileCacheIt.Val)->ChunkExpCaches).Vals = FileCache.ChunkExpCaches.Vals;
          ((FileCacheIt.Val)->ChunkExpCaches).Stats = FileCache.ChunkExpCaches.Stats;
          ((FileCacheIt.Val)->ChunkExpCaches).Size = FileCache.ChunkExpCaches.Size;
          ((FileCacheIt.Val)->ChunkExpCaches).Stats = FileCache.ChunkExpCaches.Stats;
          ((FileCacheIt.Val)->ChunkExpCaches).Size = FileCache.ChunkExpCaches.Size;
          ((FileCacheIt.Val)->ChunkExpCaches).LogCapacity = FileCache.ChunkExpCaches.LogCapacity;
          ((FileCacheIt.Val)->ChunkExpCaches).Alloc = FileCache.ChunkExpCaches.Alloc;
        }
        else {
          Insert<unsigned_long,idx2::file_cache>(&FileCacheIt,&FileId.Id,&FileCache);
        }
        (FileCacheIt.Val)->ExpCached = true;
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x12e;
        bVar10 = true;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x115;
        sVar26 = ToString(SizeMismatched);
        lVar19 = *in_FS_OFFSET;
        iVar18 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)(uint)sVar26.Size,sVar26.field_0.Ptr,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                          ,0x115);
        snprintf((char *)(lVar19 + -0xf80) + iVar18,0x400 - (long)iVar18,
                 "number of chunks is either %d or %d\n",(ulong)(uint)NChunks,uVar16 & 0xffffffff);
        __return_storage_ptr__ = local_2b8;
LAB_00176a68:
        bVar10 = false;
      }
      D = local_2c8;
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:249:3)>
      ::~scope_guard(&__ScopeGuard__249);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:243:3)>
      ::~scope_guard(&__ScopeGuard__243);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:240:3)>
      ::~scope_guard(&__ScopeGuard__240);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:227:3)>
      ::~scope_guard(&__ScopeGuard__227);
      Subband = (i8)local_2a8;
      if (bVar10) {
        pbVar24 = (FileCacheIt.Ht)->Stats;
        Brick = local_1f0;
        goto LAB_00176ace;
      }
    }
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x154;
  sVar26 = ToString(FileNotFound);
  lVar19 = *in_FS_OFFSET;
  iVar18 = snprintf((char *)(lVar19 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                    (ulong)(uint)sVar26.Size,sVar26.field_0.Ptr,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                    ,0x154);
  snprintf((char *)(lVar19 + -0xf80) + iVar18,0x400 - (long)iVar18,"File: %s\n",
           FileId.Name.field_0.Ptr);
  __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001aec18;
  (__return_storage_ptr__->field_1).Err.Msg = "File: %s\n";
  (__return_storage_ptr__->field_1).Err.StrGened = true;
  *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x25;
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xb) =
       FileCache.ChunkOffsets.Buffer.Data._0_4_;
  *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0xf) =
       FileCache.ChunkOffsets.Buffer.Data._4_1_;
  __return_storage_ptr__->Ok = false;
LAB_0017705b:
  std::unique_lock<std::mutex>::~unique_lock(&Lock);
  return __return_storage_ptr__;
}

Assistant:

expected<chunk_exp_cache, idx2_err_code>
ParallelReadChunkExponents(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
    auto ChunkExpCacheIt = Lookup(D->FileCache.ChunkExpCaches, ChunkAddress);
    if (ChunkExpCacheIt)
      return *ChunkExpCacheIt.Val;

    // here we release he lock and read the chunk
    // read the block
    buffer buff;
    bool Result = Idx2.external_read(Idx2, buff, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    // decompress the block
    chunk_exp_cache ChunkExpCache;
    bitstream& ChunkExpStream = ChunkExpCache.ChunkExpStream;
    DecompressBufZstd(buff, &ChunkExpStream);
    InitRead(&ChunkExpCache.ChunkExpStream, ChunkExpStream.Stream);
    Insert(&ChunkExpCacheIt, ChunkAddress, ChunkExpCache);
    return *ChunkExpCacheIt.Val;
  }
#endif
  std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  auto Result = ParallelReadFileExponents(Idx2, D, Level, &FileCacheIt, FileId);
  if (!Result || !FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkExpCaches)::iterator ChunkCacheIt;
  // TODO: lock and be careful about invalidated pointer
  ChunkCacheIt = Lookup(FileCache->ChunkExpCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);

  chunk_exp_cache* ChunkExpCache = ChunkCacheIt.Val;
  if (Size(ChunkExpCache->ChunkExpStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkExpCache->ChunkPos;
    i64 ChunkExpOffset = FileCache->ExponentBeginOffset;
    i32 ChunkExpSize = FileCache->ChunkExpOffsets[ChunkPos];
    if (ChunkPos > 0)
    {
      i32 PrevChunkOffset = FileCache->ChunkExpOffsets[ChunkPos - 1];
      ChunkExpOffset += PrevChunkOffset;
      ChunkExpSize -= PrevChunkOffset;
    }
    idx2_FSeek(Fp, ChunkExpOffset, SEEK_SET);
    bitstream& ChunkExpStream = ChunkExpCache->ChunkExpStream;
    idx2_ScopeBuffer(CompressedChunkExpsBuf, ChunkExpSize);
    ReadBuffer(Fp, &CompressedChunkExpsBuf, ChunkExpSize);
    DecompressBufZstd(CompressedChunkExpsBuf, &ChunkExpStream);
    D->BytesDecoded_ += ChunkExpSize;
    D->BytesExps_ += ChunkExpSize;
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    InitRead(&ChunkExpStream, ChunkExpStream.Stream);
  }

  return *ChunkCacheIt.Val;
}